

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O1

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::lineTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 tangent,float length
          )

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  
  auVar22._4_60_ = tangent._12_60_;
  auVar22._0_4_ = tangent.field_2;
  auVar21._8_56_ = tangent._8_56_;
  auVar21._0_8_ = tangent._0_8_;
  auVar20._4_60_ = center._12_60_;
  auVar20._0_4_ = center.field_2;
  auVar18._8_56_ = center._8_56_;
  auVar18._0_8_ = center._0_8_;
  auVar10 = auVar18._0_16_;
  auVar17._4_60_ = rayDir._12_60_;
  auVar17._0_4_ = rayDir.field_2;
  auVar15._8_56_ = rayDir._8_56_;
  auVar15._0_8_ = rayDir._0_8_;
  auVar14._4_60_ = raySource._12_60_;
  auVar14._0_4_ = raySource.field_2;
  auVar13._8_56_ = raySource._8_56_;
  auVar13._0_8_ = raySource._0_8_;
  auVar9 = auVar13._0_16_;
  auVar12 = auVar15._0_16_;
  auVar19 = vmovshdup_avx(auVar12);
  auVar11 = auVar21._0_16_;
  auVar5 = vmovshdup_avx(auVar11);
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar17._0_4_)),auVar19,auVar22._0_16_);
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(rayDir.field_0.x * auVar22._0_4_)),auVar17._0_16_,auVar11)
  ;
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(auVar19._0_4_ * tangent.field_0.x)),auVar12,auVar5);
  auVar5._0_4_ = auVar2._0_4_;
  fVar8 = auVar6._0_4_;
  fVar26 = auVar19._0_4_;
  fVar7 = fVar26 * fVar26 + fVar8 * fVar8 + auVar5._0_4_ * auVar5._0_4_;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    auVar19 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar19._0_4_;
  }
  if (1e-06 <= fVar7) {
    auVar19 = vinsertps_avx(auVar10,auVar9,0x1c);
    auVar2 = vinsertps_avx(auVar9,auVar10,0x1c);
    auVar16 = vsubps_avx(auVar19,auVar2);
    auVar19 = vinsertps_avx(auVar9,auVar10,0x4c);
    auVar2 = vinsertps_avx(auVar10,auVar9,0x4c);
    auVar4 = vsubps_avx512vl(auVar19,auVar2);
    auVar2 = vinsertps_avx(auVar14._0_16_,auVar20._0_16_,0x10);
    auVar19 = vshufps_avx(auVar2,auVar2,0xe1);
    auVar10 = vsubps_avx(auVar19,auVar2);
    auVar19 = vinsertps_avx(auVar22._0_16_,auVar17._0_16_,0x10);
    auVar27._4_4_ = fVar8;
    auVar27._0_4_ = fVar8;
    auVar27._8_4_ = fVar8;
    auVar27._12_4_ = fVar8;
    auVar9._0_4_ = fVar8 * auVar19._0_4_;
    auVar9._4_4_ = fVar8 * auVar19._4_4_;
    auVar9._8_4_ = fVar8 * auVar19._8_4_;
    auVar9._12_4_ = fVar8 * auVar19._12_4_;
    auVar6 = vinsertps_avx(auVar12,auVar11,0x4c);
    auVar24._4_4_ = fVar26;
    auVar24._0_4_ = fVar26;
    auVar24._8_4_ = fVar26;
    auVar24._12_4_ = fVar26;
    auVar24 = vfmsub231ps_fma(auVar9,auVar6,auVar24);
    auVar9 = vinsertps_avx(auVar11,auVar12,0x1c);
    auVar25._0_4_ = auVar9._0_4_ * fVar26;
    auVar25._4_4_ = auVar9._4_4_ * fVar26;
    auVar25._8_4_ = auVar9._8_4_ * fVar26;
    auVar25._12_4_ = auVar9._12_4_ * fVar26;
    auVar5._4_4_ = auVar5._0_4_;
    auVar5._8_4_ = auVar5._0_4_;
    auVar5._12_4_ = auVar5._0_4_;
    auVar25 = vfmsub231ps_fma(auVar25,auVar19,auVar5);
    auVar23._0_4_ = auVar6._0_4_ * auVar5._0_4_;
    auVar23._4_4_ = auVar6._4_4_ * auVar5._0_4_;
    auVar23._8_4_ = auVar6._8_4_ * auVar5._0_4_;
    auVar23._12_4_ = auVar6._12_4_ * auVar5._0_4_;
    auVar23 = vfmsub231ps_fma(auVar23,auVar9,auVar27);
    auVar5 = vmulps_avx512vl(auVar4,auVar25);
    auVar4._0_4_ = auVar16._0_4_ * auVar24._0_4_ + auVar5._0_4_ + auVar10._0_4_ * auVar23._0_4_;
    auVar4._4_4_ = auVar16._4_4_ * auVar24._4_4_ + auVar5._4_4_ + auVar10._4_4_ * auVar23._4_4_;
    auVar4._8_4_ = auVar16._8_4_ * auVar24._8_4_ + auVar5._8_4_ + auVar10._8_4_ * auVar23._8_4_;
    auVar4._12_4_ =
         auVar16._12_4_ * auVar24._12_4_ + auVar5._12_4_ + auVar10._12_4_ * auVar23._12_4_;
    auVar5 = vinsertps_avx(auVar12,auVar11,0x1c);
    auVar6 = vinsertps_avx(auVar11,auVar12,0x4c);
    auVar9 = vshufps_avx(auVar19,auVar19,0xe1);
    auVar19._0_4_ =
         auVar23._0_4_ * auVar9._0_4_ + auVar5._0_4_ * auVar24._0_4_ + auVar25._0_4_ * auVar6._0_4_;
    auVar19._4_4_ =
         auVar23._4_4_ * auVar9._4_4_ + auVar5._4_4_ * auVar24._4_4_ + auVar25._4_4_ * auVar6._4_4_;
    auVar19._8_4_ =
         auVar23._8_4_ * auVar9._8_4_ + auVar5._8_4_ * auVar24._8_4_ + auVar25._8_4_ * auVar6._8_4_;
    auVar19._12_4_ =
         auVar23._12_4_ * auVar9._12_4_ +
         auVar5._12_4_ * auVar24._12_4_ + auVar25._12_4_ * auVar6._12_4_;
    auVar19 = vdivps_avx(auVar4,auVar19);
    auVar5 = vmovshdup_avx(auVar19);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(ZEXT416((uint)length),auVar6);
    if (((auVar6._0_4_ <= auVar5._0_4_) &&
        (auVar12 = vucomiss_avx512f(ZEXT416((uint)length)), auVar6._0_4_ <= auVar5._0_4_)) &&
       (fVar7 = auVar19._0_4_, 0.0 <= fVar7)) {
      auVar10._0_4_ = auVar9._0_4_ * fVar7 + auVar2._0_4_;
      auVar10._4_4_ = auVar9._4_4_ * auVar19._4_4_ + auVar2._4_4_;
      auVar10._8_4_ = auVar9._8_4_ * auVar19._8_4_ + auVar2._8_4_;
      auVar10._12_4_ = auVar9._12_4_ * auVar19._12_4_ + auVar2._12_4_;
      auVar5 = vhsubps_avx(auVar10,auVar10);
      auVar2 = vmovshdup_avx(auVar10);
      auVar11._0_4_ = raySource.field_0.x + fVar7 * rayDir.field_0.x;
      auVar11._4_4_ = raySource.field_1.y + fVar7 * rayDir.field_1.y;
      auVar11._8_4_ = raySource.field_2 + fVar7 * rayDir.field_2;
      auVar11._12_4_ = raySource._12_4_ + fVar7 * rayDir._12_4_;
      auVar16._0_4_ = auVar12._0_4_ * tangent.field_0.x + center.field_0.x;
      auVar16._4_4_ = auVar12._4_4_ * tangent.field_1.y + center.field_1.y;
      auVar16._8_4_ = auVar12._8_4_ * tangent.field_2 + center.field_2;
      auVar16._12_4_ = auVar12._12_4_ * tangent._12_4_ + center._12_4_;
      auVar19 = vsubps_avx(auVar11,auVar16);
      auVar12._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar12._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar12._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar12._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar19 = vhaddps_avx(auVar12,auVar12);
      fVar8 = auVar5._0_4_ * auVar5._0_4_ + auVar19._0_4_;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        auVar19 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
        fVar8 = auVar19._0_4_;
      }
      fVar26 = auVar2._0_4_;
      uVar1 = vmovlps_avx(auVar16);
      p_Var3 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      goto LAB_00237ddb;
    }
  }
  p_Var3 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  fVar7 = -1.0;
  fVar8 = INFINITY;
  fVar26 = 0.0;
LAB_00237ddb:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
       fVar26;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar8;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = fVar7;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::lineTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                  glm::vec3 center, glm::vec3 tangent, float length) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 nBetween = glm::cross(rayDir, tangent);
  if (glm::length(nBetween) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  glm::vec3 nTan = glm::cross(tangent, nBetween);
  glm::vec3 nRay = glm::cross(rayDir, nBetween);

  float tRay = glm::dot(center - raySource, nTan) / glm::dot(rayDir, nTan);
  float tLine = glm::dot(raySource - center, nRay) / glm::dot(tangent, nRay);

  if (tLine < -length || tLine > length || tRay < 0)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // out of bounds or beind

  glm::vec3 pRay = raySource + tRay * rayDir;
  glm::vec3 pLine = center + tLine * tangent;

  return ret_t{tRay, glm::length(pRay - pLine), pLine};
}